

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_rawget(lua_State *L,int idx)

{
  long lVar1;
  byte bVar2;
  TValue *pTVar3;
  TValue *key;
  
  pTVar3 = index2value(L,idx);
  key = (TValue *)((L->top).offset + -0x10);
  bVar2 = luaH_get((Table *)(pTVar3->value_).gc,key,key);
  lVar1 = (L->top).offset;
  (L->top).p = (StkId)(lVar1 + -0x10);
  if ((bVar2 & 0xf) == 0) {
    *(undefined1 *)(lVar1 + -8) = 0;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return (int)(bVar2 & 0xf);
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  Table *t;
  lu_byte tag;
  lua_lock(L);
  api_checkpop(L, 1);
  t = gettable(L, idx);
  tag = luaH_get(t, s2v(L->top.p - 1), s2v(L->top.p - 1));
  L->top.p--;  /* pop key */
  return finishrawget(L, tag);
}